

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int stringindex(context *ctx,char *str,size_t sz)

{
  lua_State *L;
  int iVar1;
  lua_Integer n;
  
  L = ctx->L;
  lua_pushlstring(L,str,sz);
  lua_pushvalue(L,-1);
  lua_rawget(L,1);
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    n = (long)ctx->string_index + 1;
    ctx->string_index = (int)n;
    lua_settop(L,-2);
    lua_pushinteger(L,n);
    lua_rawset(L,1);
  }
  else {
    n = lua_tointegerx(L,-1,(int *)0x0);
    lua_settop(L,-3);
  }
  return (int)n;
}

Assistant:

static int
stringindex(struct context *ctx, const char * str, size_t sz) {
	lua_State *L = ctx->L;
	lua_pushlstring(L, str, sz);
	lua_pushvalue(L, -1);
	lua_rawget(L, 1);
	int index;
	// stringmap(1) str index
	if (lua_isnil(L, -1)) {
		index = ++ctx->string_index;
		lua_pop(L, 1);
		lua_pushinteger(L, index);
		lua_rawset(L, 1);
	} else {
		index = lua_tointeger(L, -1);
		lua_pop(L, 2);
	}
	return index;
}